

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlSAXUserParseMemory(xmlSAXHandlerPtr sax,void *user_data,char *buffer,int size)

{
  _xmlSAXHandler *p_Var1;
  xmlParserCtxtPtr ctxt_00;
  _xmlSAXHandler *p_Var2;
  xmlParserCtxtPtr ctxt;
  int ret;
  int size_local;
  char *buffer_local;
  void *user_data_local;
  xmlSAXHandlerPtr sax_local;
  
  xmlInitParser();
  ctxt_00 = xmlCreateMemoryParserCtxt(buffer,size);
  if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
    sax_local._4_4_ = -1;
  }
  else {
    p_Var1 = ctxt_00->sax;
    p_Var2 = (_xmlSAXHandler *)__xmlDefaultSAXHandler();
    if (p_Var1 != p_Var2) {
      (*xmlFree)(ctxt_00->sax);
    }
    ctxt_00->sax = sax;
    xmlDetectSAX2(ctxt_00);
    if (user_data != (void *)0x0) {
      ctxt_00->userData = user_data;
    }
    xmlParseDocument(ctxt_00);
    if (ctxt_00->wellFormed == 0) {
      if (ctxt_00->errNo == 0) {
        ctxt._0_4_ = -1;
      }
      else {
        ctxt._0_4_ = ctxt_00->errNo;
      }
    }
    else {
      ctxt._0_4_ = 0;
    }
    if (sax != (xmlSAXHandlerPtr)0x0) {
      ctxt_00->sax = (_xmlSAXHandler *)0x0;
    }
    if (ctxt_00->myDoc != (xmlDocPtr)0x0) {
      xmlFreeDoc(ctxt_00->myDoc);
      ctxt_00->myDoc = (xmlDocPtr)0x0;
    }
    xmlFreeParserCtxt(ctxt_00);
    sax_local._4_4_ = (int)ctxt;
  }
  return sax_local._4_4_;
}

Assistant:

int xmlSAXUserParseMemory(xmlSAXHandlerPtr sax, void *user_data,
			  const char *buffer, int size) {
    int ret = 0;
    xmlParserCtxtPtr ctxt;

    xmlInitParser();

    ctxt = xmlCreateMemoryParserCtxt(buffer, size);
    if (ctxt == NULL) return -1;
    if (ctxt->sax != (xmlSAXHandlerPtr) &xmlDefaultSAXHandler)
        xmlFree(ctxt->sax);
    ctxt->sax = sax;
    xmlDetectSAX2(ctxt);

    if (user_data != NULL)
	ctxt->userData = user_data;

    xmlParseDocument(ctxt);

    if (ctxt->wellFormed)
	ret = 0;
    else {
        if (ctxt->errNo != 0)
	    ret = ctxt->errNo;
	else
	    ret = -1;
    }
    if (sax != NULL)
        ctxt->sax = NULL;
    if (ctxt->myDoc != NULL) {
        xmlFreeDoc(ctxt->myDoc);
	ctxt->myDoc = NULL;
    }
    xmlFreeParserCtxt(ctxt);

    return ret;
}